

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcUtil.c
# Opt level: O0

Lpk_Fun_t * Lpk_FunDup(Lpk_Fun_t *p,uint *pTruth)

{
  uint uVar1;
  Lpk_Fun_t *p_00;
  uint *pOut;
  Lpk_Fun_t *pNew;
  uint *pTruth_local;
  Lpk_Fun_t *p_local;
  
  p_00 = Lpk_FunAlloc(*(uint *)&p->field_0x8 >> 7 & 0x1f);
  uVar1 = Vec_PtrSize(p->vNodes);
  *(uint *)&p_00->field_0x8 = *(uint *)&p_00->field_0x8 & 0xffffff80 | uVar1 & 0x7f;
  p_00->vNodes = p->vNodes;
  *(uint *)&p_00->field_0x8 =
       *(uint *)&p_00->field_0x8 & 0xfffff07f | (*(uint *)&p->field_0x8 >> 7 & 0x1f) << 7;
  *(uint *)&p_00->field_0x8 =
       *(uint *)&p_00->field_0x8 & 0xffff0fff | (*(uint *)&p->field_0x8 >> 0xc & 0xf) << 0xc;
  *(uint *)&p_00->field_0x8 =
       *(uint *)&p_00->field_0x8 & 0xffe0ffff | (*(uint *)&p->field_0x8 >> 0x10 & 0x1f) << 0x10;
  *(uint *)&p_00->field_0x8 =
       *(uint *)&p_00->field_0x8 & 0xc01fffff | (*(uint *)&p->field_0x8 >> 0x15 & 0x1ff) << 0x15;
  uVar1 = Kit_TruthSupport(pTruth,*(uint *)&p->field_0x8 >> 7 & 0x1f);
  p_00->uSupp = uVar1;
  pOut = Lpk_FunTruth(p_00,0);
  Kit_TruthCopy(pOut,pTruth,*(uint *)&p->field_0x8 >> 7 & 0x1f);
  *(undefined8 *)p_00->pFanins = *(undefined8 *)p->pFanins;
  *(undefined8 *)(p_00->pFanins + 8) = *(undefined8 *)(p->pFanins + 8);
  *(undefined8 *)p_00->pDelays = *(undefined8 *)p->pDelays;
  *(undefined8 *)(p_00->pDelays + 8) = *(undefined8 *)(p->pDelays + 8);
  Vec_PtrPush(p->vNodes,p_00);
  return p_00;
}

Assistant:

Lpk_Fun_t * Lpk_FunDup( Lpk_Fun_t * p, unsigned * pTruth )
{
    Lpk_Fun_t * pNew;
    pNew = Lpk_FunAlloc( p->nVars );
    pNew->Id = Vec_PtrSize(p->vNodes);
    pNew->vNodes = p->vNodes;
    pNew->nVars = p->nVars;
    pNew->nLutK = p->nLutK;
    pNew->nAreaLim = p->nAreaLim;
    pNew->nDelayLim = p->nDelayLim;
    pNew->uSupp = Kit_TruthSupport( pTruth, p->nVars );
    Kit_TruthCopy( Lpk_FunTruth(pNew,0), pTruth, p->nVars );
    memcpy( pNew->pFanins, p->pFanins, 16 );
    memcpy( pNew->pDelays, p->pDelays, 16 );
    Vec_PtrPush( p->vNodes, pNew );
    return pNew;
}